

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::UnaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&>::UnaryExpr
          (UnaryExpr<const_entityx::ComponentHandle<Position,_entityx::EntityManager>_&> *this,
          ComponentHandle<Position,_entityx::EntityManager> *lhs)

{
  bool result;
  _func_int **in_RSI;
  ITransientExpression *in_RDI;
  
  result = entityx::ComponentHandle::operator_cast_to_bool
                     ((ComponentHandle<Position,_entityx::EntityManager> *)0x2f4a11);
  ITransientExpression::ITransientExpression(in_RDI,false,result);
  in_RDI->_vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003cebb8;
  in_RDI[1]._vptr_ITransientExpression = in_RSI;
  return;
}

Assistant:

explicit UnaryExpr( LhsT lhs )
        :   ITransientExpression{ false, static_cast<bool>(lhs) },
            m_lhs( lhs )
        {}